

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode DiagnosticInfo_copy(UA_DiagnosticInfo *src,UA_DiagnosticInfo *dst,UA_DataType *_)

{
  size_t sVar1;
  undefined4 uVar2;
  UA_Int32 UVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  UA_Int32 UVar6;
  UA_Int32 UVar7;
  UA_Int32 UVar8;
  byte bVar9;
  UA_StatusCode UVar10;
  UA_StatusCode UVar11;
  UA_DiagnosticInfo *dst_00;
  UA_DataType *__00;
  
  uVar5 = *(undefined4 *)&src->field_0x0;
  UVar6 = src->symbolicId;
  UVar7 = src->namespaceUri;
  UVar8 = src->localizedText;
  UVar3 = src->locale;
  uVar4 = *(undefined4 *)&src->field_0x14;
  sVar1 = (src->additionalInfo).length;
  UVar10 = src->innerStatusCode;
  uVar2 = *(undefined4 *)&src->field_0x2c;
  (dst->additionalInfo).data = (src->additionalInfo).data;
  dst->innerStatusCode = UVar10;
  *(undefined4 *)&dst->field_0x2c = uVar2;
  dst->locale = UVar3;
  *(undefined4 *)&dst->field_0x14 = uVar4;
  (dst->additionalInfo).length = sVar1;
  *(undefined4 *)&dst->field_0x0 = uVar5;
  dst->symbolicId = UVar6;
  dst->namespaceUri = UVar7;
  dst->localizedText = UVar8;
  (dst->additionalInfo).length = 0;
  (dst->additionalInfo).data = (UA_Byte *)0x0;
  dst->innerDiagnosticInfo = (UA_DiagnosticInfo *)0x0;
  bVar9 = *(byte *)src;
  UVar10 = 0;
  if ((bVar9 & 0x10) != 0) {
    UVar10 = UA_String_copy(&src->additionalInfo,&dst->additionalInfo);
    bVar9 = *(byte *)src;
  }
  if (((bVar9 & 0x40) != 0) && (src->innerDiagnosticInfo != (UA_DiagnosticInfo *)0x0)) {
    dst_00 = (UA_DiagnosticInfo *)malloc(0x38);
    dst->innerDiagnosticInfo = dst_00;
    if (dst_00 == (UA_DiagnosticInfo *)0x0) {
      *(byte *)dst = *(byte *)dst & 0xbf;
      UVar10 = UVar10 | 0x80030000;
    }
    else {
      UVar11 = DiagnosticInfo_copy(src->innerDiagnosticInfo,dst_00,__00);
      UVar10 = UVar10 | UVar11;
      *(byte *)dst = *(byte *)dst | 0x40;
    }
  }
  return UVar10;
}

Assistant:

static UA_StatusCode
DiagnosticInfo_copy(UA_DiagnosticInfo const *src, UA_DiagnosticInfo *dst,
                    const UA_DataType *_) {
    memcpy(dst, src, sizeof(UA_DiagnosticInfo));
    UA_String_init(&dst->additionalInfo);
    dst->innerDiagnosticInfo = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(src->hasAdditionalInfo)
       retval = UA_String_copy(&src->additionalInfo, &dst->additionalInfo);
    if(src->hasInnerDiagnosticInfo && src->innerDiagnosticInfo) {
        dst->innerDiagnosticInfo = (UA_DiagnosticInfo*)UA_malloc(sizeof(UA_DiagnosticInfo));
        if(dst->innerDiagnosticInfo) {
            retval |= DiagnosticInfo_copy(src->innerDiagnosticInfo,
                                          dst->innerDiagnosticInfo, NULL);
            dst->hasInnerDiagnosticInfo = true;
        } else {
            dst->hasInnerDiagnosticInfo = false;
            retval |= UA_STATUSCODE_BADOUTOFMEMORY;
        }
    }
    return retval;
}